

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::Mutex::LockSlowLoop(Mutex *this,SynchWaitParams *waitp,int flags)

{
  long *plVar1;
  MuHow pMVar2;
  PerThreadSynch *pPVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  PerThreadSynch *pPVar7;
  PerThreadSynch *pPVar8;
  GraphId id;
  SynchLocksHeld *held_locks;
  int iVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong extraout_RDX_00;
  ulong uVar10;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  PerThreadSynch *pPVar11;
  ulong uVar12;
  synchronization_internal *this_00;
  bool bVar13;
  ulong extraout_RDX;
  
  pPVar11 = (PerThreadSynch *)this;
  if (((this->mu_).super___atomic_base<long>._M_i & 0x10U) != 0) {
    PostSynchEvent(this,(uint)(waitp->how != (MuHow)kExclusiveS) * 2 + 4);
  }
  if ((waitp->thread->waitp == (SynchWaitParams *)0x0) ||
     (waitp->thread->suppress_fatal_errors != false)) {
    this_00 = (synchronization_internal *)0x0;
    do {
      pPVar7 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
      pPVar11 = pPVar7;
      CheckForMutexCorruption((intptr_t)pPVar7,"Lock");
      iVar9 = (int)extraout_RDX;
      pMVar2 = waitp->how;
      if ((pMVar2->slow_need_zero & (ulong)pPVar7) == 0) {
        LOCK();
        pPVar8 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
        bVar13 = pPVar7 == pPVar8;
        if (bVar13) {
          (this->mu_).super___atomic_base<long>._M_i =
               ((-(ulong)((flags & 1U) == 0) | 0xfffffffffffffffd) & (ulong)pPVar7 | pMVar2->fast_or
               ) + pMVar2->fast_add;
          pPVar8 = pPVar7;
        }
        UNLOCK();
        if (bVar13) {
          pPVar11 = (PerThreadSynch *)waitp->cond;
          if ((pPVar11 == (PerThreadSynch *)0x0) ||
             (bVar13 = (**(_func_bool_Condition_ptr **)&pPVar11->may_skip)((Condition *)pPVar11),
             bVar13)) goto LAB_0034074a;
          UnlockSlow(this,waitp);
          pPVar11 = (PerThreadSynch *)this;
          Block(this,waitp->thread);
          flags = flags | 1;
          this_00 = (synchronization_internal *)0x0;
          iVar9 = extraout_EDX;
        }
      }
      else {
        if (((ulong)pPVar7 & 0x44) == 0) {
          pPVar11 = (PerThreadSynch *)0x0;
          pPVar8 = Enqueue((PerThreadSynch *)0x0,waitp,(intptr_t)pPVar7,flags);
          if (pPVar8 == (PerThreadSynch *)0x0) goto LAB_0034079e;
          uVar10 = (ulong)((uint)pPVar7 & (uint)((flags & 1U) == 0) * 2 + 0xb9);
          uVar12 = uVar10 + 4;
          uVar10 = uVar10 | 0x24;
          if (((ulong)pPVar7 & 1) == 0) {
            uVar10 = uVar12;
          }
          if (waitp->how != (MuHow)kExclusiveS) {
            uVar10 = uVar12;
          }
          uVar10 = uVar10 | (ulong)pPVar8;
          LOCK();
          pPVar8 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
          bVar13 = pPVar7 == pPVar8;
          if (bVar13) {
            (this->mu_).super___atomic_base<long>._M_i = uVar10;
            pPVar8 = pPVar7;
          }
          UNLOCK();
          if (!bVar13) {
            waitp->thread->waitp = (SynchWaitParams *)0x0;
            goto LAB_00340701;
          }
LAB_00340703:
          iVar9 = (int)uVar10;
          bVar4 = false;
          if (bVar13) {
            pPVar11 = (PerThreadSynch *)this;
            Block(this,waitp->thread);
            flags = flags | 1;
            bVar4 = false;
            this_00 = (synchronization_internal *)0x0;
            iVar9 = extraout_EDX_00;
          }
        }
        else {
          uVar10 = extraout_RDX;
          if (((-(ulong)((flags & 1U) == 0) | 0xffffffffffffffdf) & pMVar2->slow_inc_need_zero &
              (ulong)pPVar7) != 0) {
            pPVar8 = pPVar7;
            if (((ulong)pPVar7 & 0x40) == 0) {
              LOCK();
              pPVar8 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
              bVar13 = pPVar7 == pPVar8;
              if (bVar13) {
                (this->mu_).super___atomic_base<long>._M_i =
                     ((ulong)((uint)((flags & 1U) == 0) * 2) | 0xffffffffffffffb9) & (ulong)pPVar7 |
                     0x44;
                pPVar8 = pPVar7;
              }
              UNLOCK();
              if (bVar13) {
                pPVar11 = (PerThreadSynch *)((ulong)pPVar8 & 0xffffffffffffff00);
                pPVar7 = Enqueue(pPVar11,waitp,(intptr_t)pPVar8,flags);
                if (pPVar7 != (PerThreadSynch *)0x0) {
                  uVar12 = (ulong)(((uint)pPVar8 & 1) << 5);
                  if (waitp->how != (MuHow)kExclusiveS) {
                    uVar12 = 0;
                  }
                  do {
                    pPVar3 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
                    LOCK();
                    pPVar8 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
                    bVar13 = pPVar3 == pPVar8;
                    if (bVar13) {
                      (this->mu_).super___atomic_base<long>._M_i =
                           (ulong)((uint)pPVar3 & 0xbb) | uVar12 | (ulong)pPVar7 | 4;
                      pPVar8 = pPVar3;
                    }
                    UNLOCK();
                  } while (!bVar13);
                  bVar13 = true;
                  uVar10 = extraout_RDX_00;
                  goto LAB_00340703;
                }
                goto LAB_003407a3;
              }
            }
LAB_00340701:
            bVar13 = false;
            goto LAB_00340703;
          }
          LOCK();
          pPVar8 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
          bVar13 = pPVar7 == pPVar8;
          if (bVar13) {
            (this->mu_).super___atomic_base<long>._M_i =
                 ((ulong)((uint)((flags & 1U) == 0) * 2) | 0xffffffffffffffbc) & (ulong)pPVar7 |
                 0x41;
            pPVar8 = pPVar7;
          }
          UNLOCK();
          if (!bVar13) goto LAB_00340701;
          plVar1 = (long *)(((ulong)pPVar8 & 0xffffffffffffff00) + 0x28);
          *plVar1 = *plVar1 + 0x100;
          do {
            pPVar11 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
            LOCK();
            pPVar8 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
            bVar13 = pPVar11 == pPVar8;
            if (bVar13) {
              (this->mu_).super___atomic_base<long>._M_i = ((ulong)pPVar11 & 0xffffffffffffffbe) + 1
              ;
              pPVar8 = pPVar11;
            }
            UNLOCK();
          } while (!bVar13);
          pPVar11 = (PerThreadSynch *)waitp->cond;
          bVar4 = true;
          if (pPVar11 == (PerThreadSynch *)0x0) {
            bVar13 = false;
          }
          else {
            bVar5 = (**(_func_bool_Condition_ptr **)&pPVar11->may_skip)((Condition *)pPVar11);
            bVar13 = false;
            uVar10 = extraout_RDX_01;
            if (!bVar5) {
              UnlockSlow(this,waitp);
              pPVar11 = (PerThreadSynch *)this;
              Block(this,waitp->thread);
              flags = flags | 1;
              bVar13 = true;
              bVar4 = false;
              this_00 = (synchronization_internal *)0x0;
              uVar10 = extraout_RDX_02;
            }
          }
          iVar9 = (int)uVar10;
          if (bVar13) goto LAB_00340701;
        }
        if (bVar4) {
LAB_0034074a:
          if ((waitp->thread->waitp == (SynchWaitParams *)0x0) ||
             (waitp->thread->suppress_fatal_errors != false)) {
            if (((ulong)pPVar8 & 0x10) != 0) {
              PostSynchEvent(this,(uint)(waitp->how != (MuHow)kExclusiveS) * 2 + 5);
              return;
            }
            return;
          }
          goto LAB_003407ad;
        }
      }
      if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
         (waitp->thread->suppress_fatal_errors == false)) goto LAB_00340799;
      uVar6 = synchronization_internal::MutexDelay(this_00,1,iVar9);
      this_00 = (synchronization_internal *)(ulong)uVar6;
    } while( true );
  }
LAB_003407a8:
  LockSlowLoop();
LAB_003407ad:
  LockSlowLoop();
  pPVar7 = pPVar11->next;
  iVar9 = 1;
  if (((ulong)pPVar7 & 9) == 0) {
    LOCK();
    bVar13 = pPVar7 == pPVar11->next;
    if (bVar13) {
      pPVar11->next = (PerThreadSynch *)((ulong)pPVar7 | 8);
    }
    UNLOCK();
    if (bVar13) {
      if (_ZN4absl12lts_2025012712_GLOBAL__N_124synch_deadlock_detectionE_0 != 0) {
        id = GetGraphId((Mutex *)pPVar11);
        held_locks = Synch_GetAllLocks();
        LockEnter((Mutex *)pPVar11,id,held_locks);
      }
      iVar9 = 0;
    }
  }
  PostSynchEvent(pPVar11,iVar9);
  return;
LAB_00340799:
  LockSlowLoop();
LAB_0034079e:
  LockSlowLoop();
LAB_003407a3:
  LockSlowLoop();
  goto LAB_003407a8;
}

Assistant:

void Mutex::LockSlowLoop(SynchWaitParams* waitp, int flags) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(
        this, waitp->how == kExclusive ? SYNCH_EV_LOCK : SYNCH_EV_READERLOCK);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    CheckForMutexCorruption(v, "Lock");
    if ((v & waitp->how->slow_need_zero) == 0) {
      if (mu_.compare_exchange_strong(
              v,
              (waitp->how->fast_or |
               (v & ClearDesignatedWakerMask(flags & kMuHasBlocked))) +
                  waitp->how->fast_add,
              std::memory_order_acquire, std::memory_order_relaxed)) {
        if (waitp->cond == nullptr ||
            EvalConditionAnnotated(waitp->cond, this, true, false,
                                   waitp->how == kShared)) {
          break;  // we timed out, or condition true, so return
        }
        this->UnlockSlow(waitp);  // got lock but condition false
        this->Block(waitp->thread);
        flags |= kMuHasBlocked;
        c = 0;
      }
    } else {  // need to access waiter list
      bool dowait = false;
      if ((v & (kMuSpin | kMuWait)) == 0) {  // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch* new_h = Enqueue(nullptr, waitp, v, flags);
        intptr_t nv =
            (v & ClearDesignatedWakerMask(flags & kMuHasBlocked) & kMuLow) |
            kMuWait;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to empty list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          nv |= kMuWrWait;
        }
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | nv,
                std::memory_order_release, std::memory_order_relaxed)) {
          dowait = true;
        } else {  // attempted Enqueue() failed
          // zero out the waitp field set by Enqueue()
          waitp->thread->waitp = nullptr;
        }
      } else if ((v & waitp->how->slow_inc_need_zero &
                  IgnoreWaitingWritersMask(flags & kMuHasBlocked)) == 0) {
        // This is a reader that needs to increment the reader count,
        // but the count is currently held in the last waiter.
        if (mu_.compare_exchange_strong(
                v,
                (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                    kMuSpin | kMuReader,
                std::memory_order_acquire, std::memory_order_relaxed)) {
          PerThreadSynch* h = GetPerThreadSynch(v);
          h->readers += kMuOne;  // inc reader count in waiter
          do {                   // release spinlock
            v = mu_.load(std::memory_order_relaxed);
          } while (!mu_.compare_exchange_weak(v, (v & ~kMuSpin) | kMuReader,
                                              std::memory_order_release,
                                              std::memory_order_relaxed));
          if (waitp->cond == nullptr ||
              EvalConditionAnnotated(waitp->cond, this, true, false,
                                     waitp->how == kShared)) {
            break;  // we timed out, or condition true, so return
          }
          this->UnlockSlow(waitp);  // got lock but condition false
          this->Block(waitp->thread);
          flags |= kMuHasBlocked;
          c = 0;
        }
      } else if ((v & kMuSpin) == 0 &&  // attempt to queue ourselves
                 mu_.compare_exchange_strong(
                     v,
                     (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                         kMuSpin | kMuWait,
                     std::memory_order_acquire, std::memory_order_relaxed)) {
        PerThreadSynch* h = GetPerThreadSynch(v);
        PerThreadSynch* new_h = Enqueue(h, waitp, v, flags);
        intptr_t wr_wait = 0;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          wr_wait = kMuWrWait;  // give priority to a waiting writer
        }
        do {  // release spinlock
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v,
            (v & (kMuLow & ~kMuSpin)) | kMuWait | wr_wait |
                reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        dowait = true;
      }
      if (dowait) {
        this->Block(waitp->thread);  // wait until removed from list or timeout
        flags |= kMuHasBlocked;
        c = 0;
      }
    }
    ABSL_RAW_CHECK(
        waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
        "detected illegal recursion into Mutex code");
    // delay, then try again
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(this, waitp->how == kExclusive
                             ? SYNCH_EV_LOCK_RETURNING
                             : SYNCH_EV_READERLOCK_RETURNING);
  }
}